

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

tuple<int,_bool> __thiscall
anon_unknown.dwarf_10a000::preprocessor<baryonyx::raw_problem>::reduce_greater_constraint
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int local_18;
  int local_14;
  
  reduce((preprocessor<baryonyx::raw_problem> *)&stack0xffffffffffffffe4,constraint);
  if (local_18 < 0) {
    iVar1 = -1;
    bVar2 = false;
  }
  else {
    iVar1 = -1;
    if (local_14 < local_1c) {
      iVar1 = local_18;
    }
    bVar2 = 0 < local_1c;
    if (0 < local_1c) {
      iVar1 = local_18;
    }
    if (0 < local_1c && local_14 < local_1c) {
      baryonyx::details::fail_fast
                ("Reached","cond",
                 "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                 ,"237");
    }
  }
  *(bool *)&this->ctx = bVar2;
  *(int *)((long)&this->ctx + 4) = iVar1;
  return (tuple<int,_bool>)(_Tuple_impl<0UL,_int,_bool>)this;
}

Assistant:

auto reduce_greater_constraint(const bx::constraint& constraint)
      -> std::tuple<int, bool>
    {
        int factor, variable, result;

        std::tie(factor, variable, result) = reduce(constraint);

        if (variable < 0)
            return std::make_tuple(-1, false);

        bool affect_0 = (factor * 0 >= result);
        bool affect_1 = (factor * 1 >= result);

        if (affect_0 && affect_1)
            return std::make_tuple(-1, false);

        if (affect_0)
            return std::make_tuple(variable, false);

        if (affect_1)
            return std::make_tuple(variable, true);

        bx_reach();
    }